

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O1

void compute_padded_integral_img_simd_early_cast_int(uint8_t *gray_image,integral_image *iimage)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  uint8_t *puVar30;
  float *pfVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  float fVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  ushort uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 in_XMM7 [16];
  
  pfVar36 = iimage->padded_data;
  iVar2 = iimage->data_width;
  lVar41 = (long)iVar2;
  iVar3 = iimage->data_height;
  uVar4 = iimage->width;
  uVar42 = (ulong)(int)uVar4;
  uVar33 = iimage->height;
  iVar27 = iVar2 - uVar4;
  uVar23 = iVar27 / 2;
  uVar34 = (ulong)uVar23;
  if (1 < iVar27) {
    uVar28 = 0;
    do {
      uVar25 = 0;
      if (7 < iVar2) {
        memset(pfVar36 + uVar28,0,(ulong)(iVar2 - 8U >> 3) * 0x20 + 0x20);
        uVar25 = (iVar2 - 8U & 0xfffffff8) + 8;
      }
      if ((int)uVar25 < iVar2) {
        memset(pfVar36 + (int)((int)uVar28 + uVar25),0,(ulong)(~uVar25 + iVar2) * 4 + 4);
      }
      uVar28 = (ulong)(uint)((int)uVar28 + iVar2);
      uVar34 = uVar34 - 1;
    } while (uVar34 != 0);
  }
  if ((int)uVar23 < iVar3) {
    iVar24 = uVar23 - 7;
    iVar29 = 8;
    if (8 < iVar24) {
      iVar29 = iVar24;
    }
    iVar32 = 0;
    do {
      lVar26 = 0;
      if (0xf < iVar27) {
        memset(pfVar36 + (int)(iVar2 * (uVar23 + iVar32)),0,(ulong)(iVar29 - 1U >> 3) * 0x20 + 0x20)
        ;
        lVar26 = 0;
        do {
          lVar26 = lVar26 + 8;
        } while (lVar26 < iVar24);
      }
      uVar25 = (uint)lVar26;
      if ((int)uVar25 < (int)uVar23) {
        memset(pfVar36 + (int)((uVar23 + iVar32) * iVar2 + uVar25),0,
               (ulong)(~uVar25 + uVar23) * 4 + 4);
      }
      iVar32 = iVar32 + 1;
    } while (iVar32 != iVar3 - uVar23);
  }
  auVar54 = _DAT_001b3720;
  pfVar39 = iimage->data;
  uVar25 = uVar4 + 3;
  if (-1 < (int)uVar4) {
    uVar25 = uVar4;
  }
  if (uVar4 + 3 < 7) {
    uVar34 = 0;
  }
  else {
    uVar34 = 0;
    auVar48 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar47 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar54,
                                  ZEXT432(*(uint *)(gray_image + uVar34)));
      auVar47 = vpsadbw_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar47 = vpaddd_avx2(auVar47,auVar48._0_32_);
      auVar45 = vpmovqd_avx512vl(auVar47);
      *(undefined1 (*) [16])(pfVar39 + uVar34) = auVar45;
      auVar47 = vpermq_avx2(auVar47,0xff);
      auVar48 = ZEXT3264(auVar47);
      uVar34 = uVar34 + 4;
    } while (uVar34 < (ulong)(long)(int)(uVar25 & 0xfffffffc));
  }
  if (uVar34 < uVar42) {
    fVar35 = pfVar39[uVar34 - 1];
    do {
      fVar35 = (float)((int)fVar35 + (uint)gray_image[uVar34]);
      pfVar39[uVar34] = fVar35;
      uVar34 = uVar34 + 1;
    } while (uVar42 != uVar34);
  }
  auVar54 = _DAT_001b3720;
  pfVar31 = iimage->data;
  if (1 < uVar33) {
    puVar30 = gray_image + uVar42;
    lVar26 = 1;
    pfVar38 = pfVar39;
    pfVar40 = pfVar31;
    pfVar37 = pfVar39;
    do {
      pfVar37 = pfVar37 + lVar41;
      if (uVar4 + 3 < 7) {
        uVar34 = 0;
      }
      else {
        auVar48 = ZEXT1664((undefined1  [16])0x0);
        uVar34 = 0;
        do {
          auVar47 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar54,
                                      ZEXT432(*(uint *)(puVar30 + uVar34)));
          auVar47 = vpsadbw_avx2(auVar47,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar47 = vpaddd_avx2(auVar47,auVar48._0_32_);
          auVar45 = *(undefined1 (*) [16])(pfVar38 + uVar34);
          auVar46 = vcvtdq2ps_avx(auVar45);
          pfVar1 = pfVar40 + uVar34;
          *pfVar1 = auVar46._0_4_ * 0.003921569;
          pfVar1[1] = auVar46._4_4_ * 0.003921569;
          pfVar1[2] = auVar46._8_4_ * 0.003921569;
          pfVar1[3] = auVar46._12_4_ * 0.003921569;
          auVar46 = vpmovqd_avx512vl(auVar47);
          auVar45 = vpaddd_avx(auVar45,auVar46);
          *(undefined1 (*) [16])(pfVar37 + uVar34) = auVar45;
          auVar47 = vpermq_avx2(auVar47,0xff);
          auVar48 = ZEXT3264(auVar47);
          uVar34 = uVar34 + 4;
        } while (uVar34 < (ulong)(long)(int)(uVar25 & 0xfffffffc));
      }
      if (uVar34 < uVar42) {
        iVar27 = (int)pfVar39[lVar26 * lVar41 + (uVar34 - 1)] -
                 (int)pfVar39[(lVar26 + -1) * lVar41 + (uVar34 - 1)];
        do {
          iVar27 = iVar27 + (uint)puVar30[uVar34];
          auVar45 = vcvtusi2ss_avx512f(in_XMM7,pfVar38[uVar34]);
          auVar46 = vcvtusi2ss_avx512f(in_XMM7,iVar27);
          fVar35 = (float)vcvttss2usi_avx512f(ZEXT416((uint)(auVar45._0_4_ + auVar46._0_4_)));
          pfVar37[uVar34] = fVar35;
          pfVar40[uVar34] = auVar45._0_4_ * 0.003921569;
          uVar34 = uVar34 + 1;
        } while (uVar42 != uVar34);
      }
      lVar26 = lVar26 + 1;
      pfVar40 = pfVar40 + lVar41;
      pfVar38 = pfVar38 + lVar41;
      puVar30 = puVar30 + uVar42;
    } while (lVar26 != (int)uVar33);
  }
  if ((int)(uVar42 - 7) == 0) {
    uVar34 = 0;
  }
  else {
    lVar26 = (long)(int)((uVar33 - 1) * iVar2);
    uVar34 = 0;
    do {
      auVar54 = vcvtdq2ps_avx(*(undefined1 (*) [32])(pfVar39 + lVar26 + uVar34));
      pfVar37 = pfVar31 + lVar26 + uVar34;
      *pfVar37 = auVar54._0_4_ * 0.003921569;
      pfVar37[1] = auVar54._4_4_ * 0.003921569;
      pfVar37[2] = auVar54._8_4_ * 0.003921569;
      pfVar37[3] = auVar54._12_4_ * 0.003921569;
      pfVar37[4] = auVar54._16_4_ * 0.003921569;
      pfVar37[5] = auVar54._20_4_ * 0.003921569;
      pfVar37[6] = auVar54._24_4_ * 0.003921569;
      pfVar37[7] = auVar54._28_4_;
      uVar34 = uVar34 + 8;
    } while (uVar34 < uVar42 - 7);
  }
  if (uVar34 <= uVar42 && uVar42 - uVar34 != 0) {
    auVar48 = vpbroadcastq_avx512f();
    lVar26 = uVar34 + (long)(int)((uVar33 - 1) * iVar2);
    uVar28 = 0;
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar50 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar51 = vbroadcastss_avx512f(ZEXT416(0x3b808081));
    do {
      auVar52 = vpbroadcastq_avx512f();
      auVar53 = vporq_avx512f(auVar52,auVar49);
      auVar52 = vporq_avx512f(auVar52,auVar50);
      uVar19 = vpcmpuq_avx512f(auVar52,auVar48,2);
      bVar21 = (byte)uVar19;
      uVar19 = vpcmpuq_avx512f(auVar53,auVar48,2);
      bVar22 = (byte)uVar19;
      uVar44 = CONCAT11(bVar22,bVar21);
      auVar53 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pfVar39 + lVar26 + uVar28));
      auVar52._4_4_ = (uint)((byte)(uVar44 >> 1) & 1) * auVar53._4_4_;
      auVar52._0_4_ = (uint)(bVar21 & 1) * auVar53._0_4_;
      auVar52._8_4_ = (uint)((byte)(uVar44 >> 2) & 1) * auVar53._8_4_;
      auVar52._12_4_ = (uint)((byte)(uVar44 >> 3) & 1) * auVar53._12_4_;
      auVar52._16_4_ = (uint)((byte)(uVar44 >> 4) & 1) * auVar53._16_4_;
      auVar52._20_4_ = (uint)((byte)(uVar44 >> 5) & 1) * auVar53._20_4_;
      auVar52._24_4_ = (uint)((byte)(uVar44 >> 6) & 1) * auVar53._24_4_;
      auVar52._28_4_ = (uint)((byte)(uVar44 >> 7) & 1) * auVar53._28_4_;
      auVar52._32_4_ = (uint)(bVar22 & 1) * auVar53._32_4_;
      auVar52._36_4_ = (uint)(bVar22 >> 1 & 1) * auVar53._36_4_;
      auVar52._40_4_ = (uint)(bVar22 >> 2 & 1) * auVar53._40_4_;
      auVar52._44_4_ = (uint)(bVar22 >> 3 & 1) * auVar53._44_4_;
      auVar52._48_4_ = (uint)(bVar22 >> 4 & 1) * auVar53._48_4_;
      auVar52._52_4_ = (uint)(bVar22 >> 5 & 1) * auVar53._52_4_;
      auVar52._56_4_ = (uint)(bVar22 >> 6 & 1) * auVar53._56_4_;
      auVar52._60_4_ = (uint)(bVar22 >> 7) * auVar53._60_4_;
      auVar52 = vcvtudq2ps_avx512f(auVar52);
      auVar52 = vmulps_avx512f(auVar52,auVar51);
      pfVar37 = pfVar31 + lVar26 + uVar28;
      bVar5 = (bool)((byte)(uVar44 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar44 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar44 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar44 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar44 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar44 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar44 >> 7) & 1);
      bVar12 = (bool)(bVar22 >> 1 & 1);
      bVar13 = (bool)(bVar22 >> 2 & 1);
      bVar14 = (bool)(bVar22 >> 3 & 1);
      bVar15 = (bool)(bVar22 >> 4 & 1);
      bVar16 = (bool)(bVar22 >> 5 & 1);
      bVar17 = (bool)(bVar22 >> 6 & 1);
      *pfVar37 = (float)((uint)(bVar21 & 1) * auVar52._0_4_ |
                        (uint)!(bool)(bVar21 & 1) * (int)*pfVar37);
      pfVar37[1] = (float)((uint)bVar5 * auVar52._4_4_ | (uint)!bVar5 * (int)pfVar37[1]);
      pfVar37[2] = (float)((uint)bVar6 * auVar52._8_4_ | (uint)!bVar6 * (int)pfVar37[2]);
      pfVar37[3] = (float)((uint)bVar7 * auVar52._12_4_ | (uint)!bVar7 * (int)pfVar37[3]);
      pfVar37[4] = (float)((uint)bVar8 * auVar52._16_4_ | (uint)!bVar8 * (int)pfVar37[4]);
      pfVar37[5] = (float)((uint)bVar9 * auVar52._20_4_ | (uint)!bVar9 * (int)pfVar37[5]);
      pfVar37[6] = (float)((uint)bVar10 * auVar52._24_4_ | (uint)!bVar10 * (int)pfVar37[6]);
      pfVar37[7] = (float)((uint)bVar11 * auVar52._28_4_ | (uint)!bVar11 * (int)pfVar37[7]);
      pfVar37[8] = (float)((uint)(bVar22 & 1) * auVar52._32_4_ |
                          (uint)!(bool)(bVar22 & 1) * (int)pfVar37[8]);
      pfVar37[9] = (float)((uint)bVar12 * auVar52._36_4_ | (uint)!bVar12 * (int)pfVar37[9]);
      pfVar37[10] = (float)((uint)bVar13 * auVar52._40_4_ | (uint)!bVar13 * (int)pfVar37[10]);
      pfVar37[0xb] = (float)((uint)bVar14 * auVar52._44_4_ | (uint)!bVar14 * (int)pfVar37[0xb]);
      pfVar37[0xc] = (float)((uint)bVar15 * auVar52._48_4_ | (uint)!bVar15 * (int)pfVar37[0xc]);
      pfVar37[0xd] = (float)((uint)bVar16 * auVar52._52_4_ | (uint)!bVar16 * (int)pfVar37[0xd]);
      pfVar37[0xe] = (float)((uint)bVar17 * auVar52._56_4_ | (uint)!bVar17 * (int)pfVar37[0xe]);
      pfVar37[0xf] = (float)((uint)(bVar22 >> 7) * auVar52._60_4_ |
                            (uint)!(bool)(bVar22 >> 7) * (int)pfVar37[0xf]);
      uVar28 = uVar28 + 0x10;
    } while (((uVar42 - uVar34) + 0xf & 0xfffffffffffffff0) != uVar28);
  }
  iVar27 = uVar23 + uVar33;
  if (0 < (int)uVar33) {
    iVar29 = uVar4 + uVar23;
    lVar26 = (long)(int)uVar23;
    pfVar39 = pfVar36 + lVar41 * lVar26;
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      fVar35 = pfVar36[(long)(int)((int)lVar26 * iVar2 + uVar23 + uVar4) + -1];
      auVar45._4_4_ = fVar35;
      auVar45._0_4_ = fVar35;
      auVar45._8_4_ = fVar35;
      auVar45._12_4_ = fVar35;
      auVar54._16_4_ = fVar35;
      auVar54._0_16_ = auVar45;
      auVar54._20_4_ = fVar35;
      auVar54._24_4_ = fVar35;
      auVar54._28_4_ = fVar35;
      lVar43 = (long)iVar29;
      iVar24 = iVar29;
      if (iVar29 < (int)(lVar41 + -7)) {
        do {
          *(undefined1 (*) [32])(pfVar39 + lVar43) = auVar54;
          lVar43 = lVar43 + 8;
        } while (lVar43 < lVar41 + -7);
        iVar24 = (int)lVar43;
      }
      if (iVar24 < iVar2) {
        auVar50 = vpbroadcastq_avx512f();
        auVar51 = vbroadcastss_avx512f(auVar45);
        uVar34 = 0;
        do {
          auVar52 = vpbroadcastq_avx512f();
          auVar53 = vporq_avx512f(auVar52,auVar48);
          auVar52 = vporq_avx512f(auVar52,auVar49);
          uVar19 = vpcmpuq_avx512f(auVar52,auVar50,2);
          uVar20 = vpcmpuq_avx512f(auVar53,auVar50,2);
          bVar21 = (byte)uVar20;
          uVar44 = CONCAT11(bVar21,(byte)uVar19);
          pfVar31 = pfVar39 + (long)iVar24 + uVar34;
          bVar5 = (bool)((byte)uVar19 & 1);
          bVar6 = (bool)((byte)(uVar44 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar44 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar44 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar44 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar44 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar44 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar44 >> 7) & 1);
          bVar13 = (bool)(bVar21 >> 1 & 1);
          bVar14 = (bool)(bVar21 >> 2 & 1);
          bVar15 = (bool)(bVar21 >> 3 & 1);
          bVar16 = (bool)(bVar21 >> 4 & 1);
          bVar17 = (bool)(bVar21 >> 5 & 1);
          bVar18 = (bool)(bVar21 >> 6 & 1);
          *pfVar31 = (float)((uint)bVar5 * auVar51._0_4_ | (uint)!bVar5 * (int)*pfVar31);
          pfVar31[1] = (float)((uint)bVar6 * auVar51._4_4_ | (uint)!bVar6 * (int)pfVar31[1]);
          pfVar31[2] = (float)((uint)bVar7 * auVar51._8_4_ | (uint)!bVar7 * (int)pfVar31[2]);
          pfVar31[3] = (float)((uint)bVar8 * auVar51._12_4_ | (uint)!bVar8 * (int)pfVar31[3]);
          pfVar31[4] = (float)((uint)bVar9 * auVar51._16_4_ | (uint)!bVar9 * (int)pfVar31[4]);
          pfVar31[5] = (float)((uint)bVar10 * auVar51._20_4_ | (uint)!bVar10 * (int)pfVar31[5]);
          pfVar31[6] = (float)((uint)bVar11 * auVar51._24_4_ | (uint)!bVar11 * (int)pfVar31[6]);
          pfVar31[7] = (float)((uint)bVar12 * auVar51._28_4_ | (uint)!bVar12 * (int)pfVar31[7]);
          pfVar31[8] = (float)((uint)(bVar21 & 1) * auVar51._32_4_ |
                              (uint)!(bool)(bVar21 & 1) * (int)pfVar31[8]);
          pfVar31[9] = (float)((uint)bVar13 * auVar51._36_4_ | (uint)!bVar13 * (int)pfVar31[9]);
          pfVar31[10] = (float)((uint)bVar14 * auVar51._40_4_ | (uint)!bVar14 * (int)pfVar31[10]);
          pfVar31[0xb] = (float)((uint)bVar15 * auVar51._44_4_ | (uint)!bVar15 * (int)pfVar31[0xb]);
          pfVar31[0xc] = (float)((uint)bVar16 * auVar51._48_4_ | (uint)!bVar16 * (int)pfVar31[0xc]);
          pfVar31[0xd] = (float)((uint)bVar17 * auVar51._52_4_ | (uint)!bVar17 * (int)pfVar31[0xd]);
          pfVar31[0xe] = (float)((uint)bVar18 * auVar51._56_4_ | (uint)!bVar18 * (int)pfVar31[0xe]);
          pfVar31[0xf] = (float)((uint)(bVar21 >> 7) * auVar51._60_4_ |
                                (uint)!(bool)(bVar21 >> 7) * (int)pfVar31[0xf]);
          uVar34 = uVar34 + 0x10;
        } while (((lVar41 - iVar24) + 0xfU & 0xfffffffffffffff0) != uVar34);
      }
      lVar26 = lVar26 + 1;
      pfVar39 = pfVar39 + lVar41;
    } while (lVar26 < iVar27);
  }
  if (iVar27 < iVar3) {
    iVar29 = (uVar23 - 7) + uVar4;
    lVar26 = (long)iVar27;
    pfVar39 = pfVar36 + (lVar26 + -1) * lVar41;
    pfVar31 = pfVar36 + lVar41 * lVar26;
    do {
      lVar43 = (long)(int)uVar23;
      uVar33 = uVar23;
      if ((int)uVar23 < iVar29) {
        do {
          *(undefined1 (*) [32])(pfVar31 + lVar43) = *(undefined1 (*) [32])(pfVar39 + lVar43);
          lVar43 = lVar43 + 8;
        } while (lVar43 < iVar29);
        uVar33 = (uint)lVar43;
      }
      if ((int)uVar33 < (int)(uVar23 + uVar4)) {
        lVar43 = (long)(int)uVar33;
        do {
          pfVar31[lVar43] = pfVar39[lVar43];
          lVar43 = lVar43 + 1;
        } while ((int)(uVar23 + uVar4) != lVar43);
      }
      lVar26 = lVar26 + 1;
      pfVar39 = pfVar39 + lVar41;
      pfVar31 = pfVar31 + lVar41;
    } while (lVar26 < iVar3);
  }
  if (iVar27 < iVar3) {
    lVar26 = (long)iVar27;
    fVar35 = pfVar36[(long)(int)((iVar27 + -1) * iVar2 + uVar23 + uVar4) + -1];
    auVar46._4_4_ = fVar35;
    auVar46._0_4_ = fVar35;
    auVar46._8_4_ = fVar35;
    auVar46._12_4_ = fVar35;
    auVar47._16_4_ = fVar35;
    auVar47._0_16_ = auVar46;
    auVar47._20_4_ = fVar35;
    auVar47._24_4_ = fVar35;
    auVar47._28_4_ = fVar35;
    iVar27 = uVar23 + uVar4;
    auVar48 = vbroadcastss_avx512f(auVar46);
    pfVar36 = pfVar36 + lVar41 * lVar26;
    auVar49 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar50 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      lVar43 = (long)iVar27;
      iVar29 = iVar27;
      if (iVar27 < (int)(lVar41 + -7)) {
        do {
          *(undefined1 (*) [32])(pfVar36 + lVar43) = auVar47;
          lVar43 = lVar43 + 8;
        } while (lVar43 < lVar41 + -7);
        iVar29 = (int)lVar43;
      }
      if (iVar29 < iVar2) {
        auVar51 = vpbroadcastq_avx512f();
        uVar34 = 0;
        do {
          auVar52 = vpbroadcastq_avx512f();
          auVar53 = vporq_avx512f(auVar52,auVar49);
          auVar52 = vporq_avx512f(auVar52,auVar50);
          uVar19 = vpcmpuq_avx512f(auVar52,auVar51,2);
          uVar20 = vpcmpuq_avx512f(auVar53,auVar51,2);
          bVar21 = (byte)uVar20;
          uVar44 = CONCAT11(bVar21,(byte)uVar19);
          pfVar39 = pfVar36 + (long)iVar29 + uVar34;
          bVar5 = (bool)((byte)uVar19 & 1);
          bVar6 = (bool)((byte)(uVar44 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar44 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar44 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar44 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar44 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar44 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar44 >> 7) & 1);
          bVar13 = (bool)(bVar21 >> 1 & 1);
          bVar14 = (bool)(bVar21 >> 2 & 1);
          bVar15 = (bool)(bVar21 >> 3 & 1);
          bVar16 = (bool)(bVar21 >> 4 & 1);
          bVar17 = (bool)(bVar21 >> 5 & 1);
          bVar18 = (bool)(bVar21 >> 6 & 1);
          *pfVar39 = (float)((uint)bVar5 * auVar48._0_4_ | (uint)!bVar5 * (int)*pfVar39);
          pfVar39[1] = (float)((uint)bVar6 * auVar48._4_4_ | (uint)!bVar6 * (int)pfVar39[1]);
          pfVar39[2] = (float)((uint)bVar7 * auVar48._8_4_ | (uint)!bVar7 * (int)pfVar39[2]);
          pfVar39[3] = (float)((uint)bVar8 * auVar48._12_4_ | (uint)!bVar8 * (int)pfVar39[3]);
          pfVar39[4] = (float)((uint)bVar9 * auVar48._16_4_ | (uint)!bVar9 * (int)pfVar39[4]);
          pfVar39[5] = (float)((uint)bVar10 * auVar48._20_4_ | (uint)!bVar10 * (int)pfVar39[5]);
          pfVar39[6] = (float)((uint)bVar11 * auVar48._24_4_ | (uint)!bVar11 * (int)pfVar39[6]);
          pfVar39[7] = (float)((uint)bVar12 * auVar48._28_4_ | (uint)!bVar12 * (int)pfVar39[7]);
          pfVar39[8] = (float)((uint)(bVar21 & 1) * auVar48._32_4_ |
                              (uint)!(bool)(bVar21 & 1) * (int)pfVar39[8]);
          pfVar39[9] = (float)((uint)bVar13 * auVar48._36_4_ | (uint)!bVar13 * (int)pfVar39[9]);
          pfVar39[10] = (float)((uint)bVar14 * auVar48._40_4_ | (uint)!bVar14 * (int)pfVar39[10]);
          pfVar39[0xb] = (float)((uint)bVar15 * auVar48._44_4_ | (uint)!bVar15 * (int)pfVar39[0xb]);
          pfVar39[0xc] = (float)((uint)bVar16 * auVar48._48_4_ | (uint)!bVar16 * (int)pfVar39[0xc]);
          pfVar39[0xd] = (float)((uint)bVar17 * auVar48._52_4_ | (uint)!bVar17 * (int)pfVar39[0xd]);
          pfVar39[0xe] = (float)((uint)bVar18 * auVar48._56_4_ | (uint)!bVar18 * (int)pfVar39[0xe]);
          pfVar39[0xf] = (float)((uint)(bVar21 >> 7) * auVar48._60_4_ |
                                (uint)!(bool)(bVar21 >> 7) * (int)pfVar39[0xf]);
          uVar34 = uVar34 + 0x10;
        } while (((lVar41 - iVar29) + 0xfU & 0xfffffffffffffff0) != uVar34);
      }
      lVar26 = lVar26 + 1;
      pfVar36 = pfVar36 + lVar41;
    } while (lVar26 < iVar3);
  }
  return;
}

Assistant:

void compute_padded_integral_img_simd_early_cast_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    float *iimage_padded_data = iimage->padded_data;

    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    __m256 zeros_float = _mm256_setzero_ps();

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        int i = 0;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        int i = 0;
        for (; i < border - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
        __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
        //__m256i ZERO = _mm256_set1_epi32(0);
        __m256i ZERO = _mm256_setzero_si256();
        
        // Implementation adapted from:
        // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
        // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

        uint32_t *iimage_idata = (uint32_t *) iimage->data;

        size_t aligned_width = width / 4 * 4;

        {
            __m256i row_sums = ZERO;
            size_t i = 0;
            for(; i < aligned_width; i+=4) {

                // If (gray_image + i) has following uint8_t pixels: a b c d
                // a0000000 ab000000 abc00000 abcd0000
                __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
                
                // Summing together blocks of 8 uint8_t's and storing results
                // uint32_t eeee = a
                // uint32_t ffff = a + b
                // uint32_t gggg = a + b + c
                // uint32_t hhhh = a + b + c + d
                // eeee0000 ffff0000 gggg0000 hhhh0000
                __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

                // Updating row_sum by adding previously computed img_sad_sum
                //   eeee0000 ffff0000 hhhh0000 hhhh0000
                // + iiii**** jjjj**** kkkk**** llll****
                // -------------------------------------
                //   mmmm**** nnnn**** oooo**** pppp****
                row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

                // Permuting row_sum from first row to second and cutting off upper 128 bits
                // mmmm**** nnnn**** oooo**** pppp****
                // mmmmnnnn oooopppp ******** ********
                __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
                
                // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
                // 
                _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
                //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
                
                // Updating row_sums to only include highest of four values (pppp)
                // mmmm**** nnnn**** oooo**** pppp****
                // pppp**** pppp**** pppp**** pppp****
                row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

            }
            uint32_t row_sum = iimage_idata[i - 1];
            for (; i < width; ++i) {
                row_sum += gray_image[i];
                iimage_idata[i] = row_sum;
            }
        }

        float *iimage_data = iimage->data;
        __m128 factor = _mm_set1_ps(1.0f / 255.0f);

        for(size_t j = 1; j < height; ++j) {

            __m256i row_sums = ZERO;

            size_t i = 0;
            for(; i < aligned_width; i+=4) {

                // If (gray_image + i) has following uint8_t pixels: a b c d
                // a0000000 ab000000 abc00000 abcd0000
                __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
                
                // Summing together blocks of 8 uint8_t's and storing results
                // uint32_t eeee = a
                // uint32_t ffff = a + b
                // uint32_t gggg = a + b + c
                // uint32_t hhhh = a + b + c + d
                // eeee0000 ffff0000 gggg0000 hhhh0000
                __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

                // Updating row_sum by adding previously computed img_sad_sum
                //   eeee0000 ffff0000 hhhh0000 hhhh0000
                // + iiii**** jjjj**** kkkk**** llll****
                // -------------------------------------
                //   mmmm**** nnnn**** oooo**** pppp****
                row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

                // Permuting row_sum from first row to second and cutting off upper 128 bits
                // mmmm**** nnnn**** oooo**** pppp****
                // mmmmnnnn oooopppp ******** ********
                __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

                // Loading row_sum from previous row
                __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
                //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

                // AVX512 only :(
                //__m128 prev_row_sums_cast = _mm_cvtepu32_ps(prev_row_sums);
                __m128 prev_row_sums_cast = _mm_cvtepi32_ps(prev_row_sums);
                //__128 prev_row_sums_cast = _my_mm_cvtepu32_ps(prev_row_sums);

                // Multiplying float version of previous row sum converted with (1.0f/255.0f) 
                __m128 prev_iimage_float = _mm_mul_ps(factor, prev_row_sums_cast);

                // Storing float of previous row sum back to memory as final integral image value
                _mm_storeu_ps(iimage_data +(j-1) * data_width + i, prev_iimage_float);

                // Adding curr_row_sums with prev_row_sums
                __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

                // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
                _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
                //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
                
                // Updating row_sums to only include highest of four values (pppp)
                // mmmm**** nnnn**** oooo**** pppp****
                // pppp**** pppp**** pppp**** pppp****
                row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

            }

            uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
            for (; i < width; ++i) {
                row_sum += gray_image[j * width + i];
                float prev_row_sum = iimage_idata[(j-1) * data_width + i];
                iimage_idata[j * data_width + i] = row_sum + prev_row_sum;
                iimage_data[(j-1) * data_width + i] = (1.0f / 255.0f) * ((float) prev_row_sum);
            }

        }

        // Converting last row to floats
        __m256 factor256 = _mm256_set1_ps(1.0f / 255.0f);
        size_t i = 0;
        for (; i < width - 7; i+=8) { // TODO: Check if -7 correct here

            __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + (height - 1) * data_width + i));
            //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

            // AVX512 only :(
            //__m256 v_float = _mm256_cvtepu32_ps(v_int);
            __m256 v_float = _mm256_cvtepi32_ps(v_int);
            //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

            // Multiplying converted float with (1.0f/255.0f) 
            __m256 v_iimage = _mm256_mul_ps(factor256, v_float);

            // Storing value back to memory
            _mm256_storeu_ps(iimage_data + (height - 1) * data_width + i, v_iimage);

        } 

        for (; i < width; ++i) {
            iimage_data[(height - 1) * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[(height - 1) * data_width + i]);
        }

    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row_float = iimage_padded_data[j * data_width + border + width - 1];
        __m256 last_element_in_row_vec = _mm256_set1_ps(last_element_in_row_float);
        int i = width + border;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, last_element_in_row_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row_float;
        }
    }

    // BLOCK D   
    for (int j = border + height; j < data_height; ++j) {
        int i = border;
        for (; i < width + border - 7; i+=8) {
            __m256 prev_elements_in_row = _mm256_loadu_ps(iimage_padded_data + (j-1) * data_width + i);
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row);
        }
        for (; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }
 
// TODO: WRITE SECOND VERSION WITH COLMAJOR
/*  
    int i = border;
    for (; i < width + border - 7; i+=8) {
        __m256 prev_elements_in_row_vec = _mm256_loadu_ps(iimage_padded_data + (border + height - 1) * data_width + i);
        for (int j = border + height; j < data_height; ++j) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row_vec);
        }
    }
    for (; i < width + border; ++i) {
        float prev_elements_in_row_float = iimage_padded_data[(border + height - 1) * data_width + i];
        for (int j = border + height; j < data_height; ++j) {
            iimage_padded_data[j * data_width + i] = prev_elements_in_row_float;
        }
    }
*/    

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value_float = iimage_padded_data[index_last_element];
    __m256 max_value_vec = _mm256_set1_ps(max_value_float);
    for (int j = border + height; j < data_height; ++j) {
        int i = border + width;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, max_value_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value_float;
        }
    }
    
}